

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long in_RCX;
  long *in_RDI;
  LodePNGColorMode *in_R9;
  size_t outsize;
  uchar *data;
  size_t in_stack_00000058;
  uchar *in_stack_00000060;
  LodePNGState *in_stack_00000068;
  uint *in_stack_00000070;
  uint *in_stack_00000078;
  uchar **in_stack_00000080;
  uint in_stack_00000088;
  uint in_stack_0000008c;
  LodePNGColorMode *in_stack_00000090;
  LodePNGColorMode *in_stack_00000098;
  uchar *in_stack_000000a0;
  uchar *in_stack_000000a8;
  LodePNGColorMode *in_stack_ffffffffffffffb8;
  LodePNGColorMode *in_stack_ffffffffffffffc0;
  uint local_4;
  
  *in_RDI = 0;
  decodeGeneric(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                in_stack_00000060,in_stack_00000058);
  if (*(int *)(in_RCX + 0x1a0) == 0) {
    if ((*(int *)(in_RCX + 0x2c) == 0) ||
       (iVar1 = lodepng_color_mode_equal
                          ((LodePNGColorMode *)(in_RCX + 0x90),(LodePNGColorMode *)(in_RCX + 200)),
       iVar1 != 0)) {
      if (*(int *)(in_RCX + 0x2c) == 0) {
        uVar2 = lodepng_color_mode_copy(in_R9,in_stack_ffffffffffffffc0);
        *(uint *)(in_RCX + 0x1a0) = uVar2;
        if (*(int *)(in_RCX + 0x1a0) != 0) {
          return *(uint *)(in_RCX + 0x1a0);
        }
      }
    }
    else {
      if (((*(int *)(in_RCX + 0x90) != 2) && (*(int *)(in_RCX + 0x90) != 6)) &&
         (*(int *)(in_RCX + 0x94) != 8)) {
        return 0x38;
      }
      lodepng_get_raw_size((uint)((ulong)*in_RDI >> 0x20),(uint)*in_RDI,in_stack_ffffffffffffffb8);
      pvVar3 = lodepng_malloc(0x2b46c6);
      *in_RDI = (long)pvVar3;
      if (*in_RDI == 0) {
        *(undefined4 *)(in_RCX + 0x1a0) = 0x53;
      }
      else {
        uVar2 = lodepng_convert(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                                in_stack_00000090,in_stack_0000008c,in_stack_00000088);
        *(uint *)(in_RCX + 0x1a0) = uVar2;
      }
      lodepng_free((void *)0x2b4742);
    }
    local_4 = *(uint *)(in_RCX + 0x1a0);
  }
  else {
    local_4 = *(uint *)(in_RCX + 0x1a0);
  }
  return local_4;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize)
{
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
  {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert)
    {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  }
  else
  {
    /*color conversion needed; sort of copy of the data*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8))
    {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out))
    {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}